

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::MultiContextTest::iterate(MultiContextTest *this)

{
  ostringstream *poVar1;
  TestLog *log;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  GLenum err;
  Library *egl;
  EGLDisplay pvVar5;
  EGLConfig pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar7;
  char *pcVar8;
  MessageBuilder *this_00;
  size_t contextNdx;
  ulong uVar9;
  UniqueDisplay display;
  EGLContext context;
  vector<void_*,_std::allocator<void_*>_> contexts;
  undefined1 local_1cb0 [32];
  EGLint attribList [3];
  UniqueSurface surface;
  EGLint pbufferAttribList [5];
  Random rng;
  ResultCollector resultCollector;
  MessageBuilder local_1be8;
  code *local_1a68;
  int local_1a60;
  Functions gl;
  EGLSurface surface_00;
  
  dVar3 = 0x86aa46;
  if (this->m_sharing == SHARING_SHARED) {
    dVar3 = 0x94ecb894;
  }
  attribList[2] = 0x3038;
  attribList[0] = 0x3098;
  attribList[1] = 2;
  pbufferAttribList[0] = 0x3057;
  pbufferAttribList[1] = 0x40;
  pbufferAttribList[2] = 0x3056;
  pbufferAttribList[3] = 0x40;
  pbufferAttribList[4] = 0x3038;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gl,"",(allocator<char> *)&local_1be8);
  tcu::ResultCollector::ResultCollector(&resultCollector,log,(string *)&gl);
  std::__cxx11::string::~string((string *)&gl);
  deRandom_init(&rng.m_rnd,dVar3);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar5 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&display,egl,pvVar5);
  pvVar5 = display.m_display;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  gl.activeTexture = (glActiveTextureFunc)0x0;
  gl.attachShader = (glAttachShaderFunc)0x0;
  eglu::FilterList::operator<<((FilterList *)&gl,isES2Renderable);
  pvVar6 = eglu::chooseSingleConfig(egl,pvVar5,(FilterList *)&gl);
  std::
  _Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ::~_Vector_base((_Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                   *)&gl);
  pvVar5 = display.m_display;
  if (this->m_use == USE_NONE) {
    surface_00 = (EGLSurface)0x0;
  }
  else {
    iVar2 = (*egl->_vptr_Library[10])(egl,display.m_display,pvVar6,pbufferAttribList);
    surface_00 = (EGLSurface)CONCAT44(extraout_var,iVar2);
  }
  eglu::UniqueSurface::UniqueSurface(&surface,egl,pvVar5,surface_00);
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,"Failed to create pbuffer.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x7f);
  contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glw::Functions::Functions(&gl);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&contexts,0x80);
  poVar1 = &local_1be8.m_str;
  local_1be8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Trying to create ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  pcVar8 = " ";
  if (this->m_sharing == SHARING_SHARED) {
    pcVar8 = " shared ";
  }
  std::operator<<((ostream *)poVar1,pcVar8);
  std::operator<<((ostream *)poVar1,"contexts.");
  tcu::MessageBuilder::operator<<(&local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1be8.m_str;
  local_1be8.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Requiring that at least ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," contexts can be created.");
  tcu::MessageBuilder::operator<<(&local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (this->m_use == USE_CLEAR) {
    EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,&gl,(ApiType)0x2);
  }
  (**egl->_vptr_Library)(egl,0x30a0);
  dVar3 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar3,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x8c);
  uVar9 = 0;
  do {
    if (uVar9 == 0x80) {
LAB_0021e275:
      uVar9 = 0;
      while( true ) {
        if ((ulong)((long)contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) <= uVar9) break;
        (*egl->_vptr_Library[0x13])
                  (egl,display.m_display,
                   contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]);
        dVar3 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar3,"destroyContext(*display, contexts[contextNdx])",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                         ,0xc6);
        contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar9] = (void *)0x0;
        uVar9 = uVar9 + 1;
      }
      if (this->m_use - USE_MAKECURRENT < 2) {
        (*egl->_vptr_Library[0x27])(egl,display.m_display,0,0,0);
        dVar3 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar3,
                         "makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                         ,0xcb);
      }
      tcu::ResultCollector::setTestContextResult
                (&resultCollector,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                (&contexts.super__Vector_base<void_*,_std::allocator<void_*>_>);
      eglu::UniqueSurface::~UniqueSurface(&surface);
      eglu::UniqueDisplay::~UniqueDisplay(&display);
      tcu::ResultCollector::~ResultCollector(&resultCollector);
      return STOP;
    }
    if (uVar9 == 0) {
      pvVar7 = (void *)0x0;
    }
    else {
      pvVar7 = (void *)0x0;
      if (this->m_sharing == SHARING_SHARED) {
        dVar3 = deRandom_getUint32(&rng.m_rnd);
        pvVar7 = contexts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(ulong)dVar3 % (uVar9 & 0xffffffff)];
      }
    }
    iVar2 = (*egl->_vptr_Library[6])(egl,display.m_display,pvVar6,pvVar7,attribList);
    context = (EGLContext)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*egl->_vptr_Library[0x1f])(egl);
    if ((iVar2 != 0x3000) || (context == (EGLContext)0x0)) {
      poVar1 = &local_1be8.m_str;
      local_1be8.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Got error after creating ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," contexts.");
      tcu::MessageBuilder::operator<<(&local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      if (iVar2 == 0x3003) {
        if (uVar9 < 0x20) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1be8,
                     "Couldn\'t create the minimum number of contexts required.",
                     (allocator<char> *)local_1cb0);
          tcu::ResultCollector::fail(&resultCollector,(string *)&local_1be8);
          this_00 = &local_1be8;
          goto LAB_0021e133;
        }
        poVar1 = &local_1be8.m_str;
        local_1be8.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Got EGL_BAD_ALLOC.");
        tcu::MessageBuilder::operator<<(&local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      else {
        local_1a68 = eglu::getErrorName;
        local_1a60 = iVar2;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)local_1cb0,&local_1a68);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1be8,"eglCreateContext() produced error that is not EGL_BAD_ALLOC: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1cb0);
        tcu::ResultCollector::fail(&resultCollector,(string *)&local_1be8);
        std::__cxx11::string::~string((string *)&local_1be8);
        this_00 = (MessageBuilder *)local_1cb0;
LAB_0021e133:
        std::__cxx11::string::~string((string *)this_00);
      }
      if (context != (EGLContext)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1be8,
                   "eglCreateContext() produced error, but context is not EGL_NO_CONTEXT",
                   (allocator<char> *)local_1cb0);
        tcu::ResultCollector::fail(&resultCollector,(string *)&local_1be8);
LAB_0021e268:
        std::__cxx11::string::~string((string *)&local_1be8);
      }
      goto LAB_0021e275;
    }
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&contexts,&context);
    if (this->m_use - USE_MAKECURRENT < 2) {
      iVar2 = (*egl->_vptr_Library[0x27])
                        (egl,display.m_display,surface.m_surface,surface.m_surface,context);
      iVar4 = (*egl->_vptr_Library[0x1f])(egl);
      if ((iVar2 == 0) || (iVar4 != 0x3000)) {
        poVar1 = &local_1be8.m_str;
        local_1be8.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,"Failed to make ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"th context current: ");
        local_1cb0._0_8_ = eglu::getErrorName;
        local_1cb0._8_4_ = iVar4;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1cb0,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<(&local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1be8,"Failed to make context current",
                   (allocator<char> *)local_1cb0);
        tcu::ResultCollector::fail(&resultCollector,(string *)&local_1be8);
        goto LAB_0021e268;
      }
      if (this->m_use == USE_CLEAR) {
        (*gl.clearColor)(0.25,0.75,0.5,1.0);
        (*gl.clear)(0x4000);
        (*gl.finish)();
        err = (*gl.getError)();
        glu::checkError(err,"Failed to clear color.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                        ,0xbe);
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

tcu::TestCase::IterateResult MultiContextTest::iterate (void)
{
	const deUint32					seed			= m_sharing == SHARING_SHARED ? 2498541716u : 8825414;
	const size_t					maxContextCount	= 128;
	const size_t					minContextCount	= 32;
	const eglw::EGLint				attribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	const eglw::EGLint				pbufferAttribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};

	TestLog&						log				= m_testCtx.getLog();
	tcu::ResultCollector			resultCollector	(log);
	de::Random						rng				(seed);

	const eglw::Library&			egl				= m_eglTestCtx.getLibrary();
	const eglu::UniqueDisplay		display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglw::EGLConfig			config			= getConfig(egl, *display);

	const eglu::UniqueSurface		surface			(egl, *display, m_use != USE_NONE ? egl.createPbufferSurface(*display, config, pbufferAttribList) : EGL_NO_SURFACE);
	EGLU_CHECK_MSG(egl, "Failed to create pbuffer.");

	std::vector<eglw::EGLContext>	contexts;
	glw::Functions					gl;

	contexts.reserve(maxContextCount);

	log << TestLog::Message << "Trying to create " << maxContextCount << (m_sharing == SHARING_SHARED ? " shared " : " ") << "contexts." << TestLog::EndMessage;
	log << TestLog::Message << "Requiring that at least " << minContextCount << " contexts can be created." << TestLog::EndMessage;

	if (m_use == USE_CLEAR)
		m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	try
	{
		for (size_t contextCount = 0; contextCount < maxContextCount; contextCount++)
		{
			const eglw::EGLContext	sharedContext	= (m_sharing == SHARING_SHARED && contextCount > 0 ? contexts[rng.getUint32() % (deUint32)contextCount] : EGL_NO_CONTEXT);
			const eglw::EGLContext	context			= egl.createContext(*display, config, sharedContext, attribList);
			const eglw::EGLint		error			= egl.getError();

			if (context == EGL_NO_CONTEXT || error != EGL_SUCCESS)
			{
				log << TestLog::Message << "Got error after creating " << contextCount << " contexts." << TestLog::EndMessage;

				if (error == EGL_BAD_ALLOC)
				{
					if (contextCount < minContextCount)
						resultCollector.fail("Couldn't create the minimum number of contexts required.");
					else
						log << TestLog::Message << "Got EGL_BAD_ALLOC." << TestLog::EndMessage;
				}
				else
					resultCollector.fail("eglCreateContext() produced error that is not EGL_BAD_ALLOC: " + eglu::getErrorStr(error).toString());

				if (context != EGL_NO_CONTEXT)
					resultCollector.fail("eglCreateContext() produced error, but context is not EGL_NO_CONTEXT");

				break;
			}
			else
			{
				contexts.push_back(context);

				if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
				{
					const eglw::EGLBoolean	result				= egl.makeCurrent(*display, *surface, *surface, context);
					const eglw::EGLint		makeCurrentError	= egl.getError();

					if (!result || makeCurrentError != EGL_SUCCESS)
					{
						log << TestLog::Message << "Failed to make " << (contextCount + 1) << "th context current: " << eglu::getErrorStr(makeCurrentError) << TestLog::EndMessage;
						resultCollector.fail("Failed to make context current");

						break;
					}
					else if (m_use == USE_CLEAR)
					{
						gl.clearColor(0.25f, 0.75f, 0.50f, 1.00f);
						gl.clear(GL_COLOR_BUFFER_BIT);
						gl.finish();
						GLU_CHECK_GLW_MSG(gl, "Failed to clear color.");
					}
				}
			}
		}

		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}
	catch (...)
	{
		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			if (contexts[contextNdx] != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		throw;
	}

	resultCollector.setTestContextResult(m_testCtx);
	return STOP;
}